

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TestEventListener *pTVar3;
  OsStackTraceGetterInterface *pOVar4;
  TestResult *pTVar5;
  TimeInMillis TVar6;
  TestInfo *pTVar7;
  int local_48;
  int local_44;
  int j;
  int i;
  Timer timer;
  bool skip_all;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestSuite *this_local;
  
  if ((this->should_run_ & 1U) == 0) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  internal::UnitTestImpl::set_current_test_suite(this_00,this);
  this_01 = UnitTest::GetInstance();
  this_02 = UnitTest::listeners(this_01);
  pTVar3 = TestEventListeners::repeater(this_02);
  (*pTVar3->_vptr_TestEventListener[6])(pTVar3,this);
  (*pTVar3->_vptr_TestEventListener[7])(pTVar3,this);
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x18b130,(char *)0x0);
  pTVar5 = ad_hoc_test_result(this);
  timer.start_.__d.__r._7_1_ = TestResult::Failed(pTVar5);
  TVar6 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar6;
  internal::Timer::Timer((Timer *)&j);
  for (local_44 = 0; iVar2 = total_test_count(this), local_44 < iVar2; local_44 = local_44 + 1) {
    if ((timer.start_.__d.__r._7_1_ & 1) == 0) {
      pTVar7 = GetMutableTestInfo(this,local_44);
      TestInfo::Run(pTVar7);
    }
    else {
      pTVar7 = GetMutableTestInfo(this,local_44);
      TestInfo::Skip(pTVar7);
    }
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      pTVar7 = GetMutableTestInfo(this,local_44);
      pTVar5 = TestInfo::result(pTVar7);
      bVar1 = TestResult::Failed(pTVar5);
      local_48 = local_44;
      if (bVar1) goto LAB_00167ef9;
    }
  }
LAB_00167f42:
  TVar6 = internal::Timer::Elapsed((Timer *)&j);
  this->elapsed_time_ = TVar6;
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x18b1a0,(char *)0x0);
  (*pTVar3->_vptr_TestEventListener[0xc])(pTVar3,this);
  (*pTVar3->_vptr_TestEventListener[0xd])(pTVar3,this);
  internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  return;
LAB_00167ef9:
  while( true ) {
    local_48 = local_48 + 1;
    iVar2 = total_test_count(this);
    if (iVar2 <= local_48) break;
    pTVar7 = GetMutableTestInfo(this,local_48);
    TestInfo::Skip(pTVar7);
  }
  goto LAB_00167f42;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all = ad_hoc_test_result().Failed();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}